

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

Vector __thiscall ipx::CopyBasic(ipx *this,Vector *x,Basis *basis)

{
  pointer piVar1;
  double *pdVar2;
  void *__s;
  double *extraout_RDX;
  double *pdVar3;
  double *pdVar4;
  Vector VVar5;
  
  pdVar4 = (double *)(long)basis->model_->num_rows_;
  *(double **)this = pdVar4;
  __s = operator_new((long)pdVar4 * 8);
  *(void **)(this + 8) = __s;
  memset(__s,0,(long)pdVar4 * 8);
  pdVar3 = extraout_RDX;
  if (0 < (long)pdVar4) {
    piVar1 = (basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = x->_M_data;
    pdVar3 = (double *)0x0;
    do {
      *(double *)((long)__s + (long)pdVar3 * 8) = pdVar2[piVar1[(long)pdVar3]];
      pdVar3 = (double *)((long)pdVar3 + 1);
    } while (pdVar4 != pdVar3);
  }
  VVar5._M_data = pdVar3;
  VVar5._M_size = (size_t)this;
  return VVar5;
}

Assistant:

Vector CopyBasic(const Vector& x, const Basis& basis) {
    const Int m = basis.model().rows();
    Vector xbasic(m);
    for (Int p = 0; p < m; p++)
        xbasic[p] = x[basis[p]];
    return xbasic;
}